

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

void __thiscall HighsHashTree<int,_void>::InnerLeaf<4>::rehash(InnerLeaf<4> *this,int hashPos)

{
  int iVar1;
  unsigned_long uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint64_t hash;
  int pos;
  int i;
  int local_30;
  int local_2c;
  
  (this->occupation).occupation = 0;
  iVar3 = this->size;
  if (0 < (long)iVar3) {
    lVar4 = 0;
    uVar6 = 0;
    do {
      uVar7 = (ulong)(uint)(this->entries)._M_elems[lVar4].value_;
      uVar7 = (uVar7 * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20 ^
              uVar7 * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32) >>
              ((char)hashPos * -6 + 0x30U & 0x3f);
      (this->hashes)._M_elems[lVar4] = uVar7 & 0xffff;
      uVar6 = uVar6 | 1L << (uVar7 >> 10 & 0x3f);
      lVar4 = lVar4 + 1;
    } while (iVar3 != lVar4);
    (this->occupation).occupation = uVar6;
    local_2c = 0;
    if (0 < iVar3) {
      iVar3 = 0;
      do {
        lVar5 = (long)iVar3;
        uVar6 = (this->hashes)._M_elems[lVar5];
        lVar4 = POPCOUNT((this->occupation).occupation >> ((byte)(uVar6 >> 10) & 0x3f));
        local_30 = (int)lVar4 + -1;
        if (iVar3 < local_30) {
          uVar2 = (this->hashes)._M_elems[local_30];
          (this->hashes)._M_elems[local_30] = uVar6;
          (this->hashes)._M_elems[lVar5] = uVar2;
          iVar1 = (this->entries)._M_elems[local_30].value_;
          (this->entries)._M_elems[local_30].value_ = (this->entries)._M_elems[lVar5].value_;
          (this->entries)._M_elems[lVar5].value_ = iVar1;
        }
        else {
          if ((int)lVar4 <= iVar3) {
            do {
              if ((this->hashes)._M_elems[lVar4 + -1] < uVar6) {
                iVar3 = (this->entries)._M_elems[lVar5].value_;
                move_backward(this,&local_30,&local_2c);
                (this->hashes)._M_elems[local_30] = uVar6;
                (this->entries)._M_elems[local_30].value_ = iVar3;
                iVar3 = local_2c;
                break;
              }
              local_30 = (int)lVar4;
              lVar4 = lVar4 + 1;
            } while (lVar5 + 1 != lVar4);
          }
          iVar3 = iVar3 + 1;
          local_2c = iVar3;
        }
      } while (iVar3 < this->size);
    }
  }
  return;
}

Assistant:

void rehash(int hashPos) {
      // function needs to possibly reorder elements by a different hash value
      // chances are very high we are already ordered correctly as we use 16
      // bits of the hash and one level is uses 6 bits, so the new values
      // are guaranteed to be ordered correctly by their 10 most significant
      // bits if increasing the hash position by 1 and only if the 10 bits of
      // the hash had a collision the new 6 bits might break a tie differently.
      // It is, however, important to maintain the exact ordering as otherwise
      // elements may not be found.
      occupation = 0;
      for (int i = 0; i < size; ++i) {
        hashes[i] = get_hash_chunks16(compute_hash(entries[i].key()), hashPos);
        occupation.set(get_first_chunk16(hashes[i]));
      }

      int i = 0;
      while (i < size) {
        uint8_t hashChunk = get_first_chunk16(hashes[i]);
        int pos = occupation.num_set_until(hashChunk) - 1;

        // if the position is after i the element definitely comes later, so we
        // swap it to that position and proceed without increasing i until
        // eventually an element appears that comes at position i or before
        if (pos > i) {
          std::swap(hashes[pos], hashes[i]);
          std::swap(entries[pos], entries[i]);
          continue;
        }

        // the position is before or at i, now check where the exact location
        // should be for the ordering by hash so that the invariant is that all
        // elements up to i are properly sorted. Essentially insertion sort but
        // with the modification of having a high chance to guess the correct
        // position already using the occupation flags.
        while (pos < i && hashes[pos] >= hashes[i]) ++pos;

        // if the final position is before i we need to move elements to
        // make space at that position, otherwise nothing needs to be done but
        // incrementing i increasing the sorted range by 1.
        if (pos < i) {
          uint64_t hash = hashes[i];
          auto entry = std::move(entries[i]);
          move_backward(pos, i);
          hashes[pos] = hash;
          entries[pos] = std::move(entry);
        }
        ++i;
      }
    }